

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-info.c
# Opt level: O3

_Bool obj_known_damage(object *obj,int *normal_damage,int *brand_damage,int *slay_damage,
                      _Bool *nonweap_slay,_Bool throw)

{
  wchar_t wVar1;
  _Bool *source;
  angband_constants *paVar2;
  player *ppVar3;
  _Bool _Var4;
  _Bool _Var5;
  int16_t iVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  object *poVar12;
  object *poVar13;
  int iVar14;
  critical_level *pcVar15;
  player *obj_00;
  wchar_t wVar16;
  player_state *state_00;
  int iVar17;
  undefined7 in_register_00000089;
  ulong uVar18;
  int iVar19;
  wchar_t wVar20;
  byte bVar21;
  int *piVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  int local_1e8;
  wchar_t local_1e4;
  wchar_t crit_round_mult;
  wchar_t crit_add;
  wchar_t crit_mult;
  _Bool *local_1b8;
  int local_1ac;
  wchar_t crit_round_add;
  wchar_t crit_div;
  _Bool *total_slays;
  player *local_198;
  ulong local_190;
  _Bool *total_brands;
  wchar_t crit_scl_round;
  ulong local_178;
  ulong local_170;
  int *local_168;
  int *local_160;
  int *local_158;
  player_state state;
  
  local_1b8 = nonweap_slay;
  local_168 = normal_damage;
  local_160 = brand_damage;
  local_158 = slay_damage;
  poVar12 = equipped_item_by_slot_name(player,"shooting");
  _Var4 = tval_is_melee_weapon(obj);
  local_1ac = (int)CONCAT71(in_register_00000089,throw);
  bVar23 = !throw;
  bVar25 = (player->state).ammo_tval == (uint)obj->tval;
  bVar26 = poVar12 != (object *)0x0;
  wVar7 = slot_by_name(player,"weapon");
  poVar13 = slot_object(player,wVar7);
  if (_Var4 && bVar23) {
    (player->body).slots[wVar7].obj = obj;
  }
  ppVar3 = player;
  memcpy(&state,&player->state,0x120);
  state.stat_ind[0] = L'\0';
  state.stat_ind[3] = L'\0';
  calc_bonuses(ppVar3,(player_state_conflict *)&state,true,false);
  (player->body).slots[wVar7].obj = poVar13;
  poVar13 = obj->known;
  if (poVar13->ds == 0 || poVar13->dd == 0) {
    return false;
  }
  bVar24 = bVar23 && (bVar25 && bVar26);
  iVar11 = (uint)poVar13->dd * (poVar13->ds + 1) * 5;
  local_198 = (player *)obj;
  wVar7 = object_to_hit(poVar13);
  obj_00 = local_198;
  ppVar3 = player;
  if (_Var4 && bVar23) {
    wVar8 = object_to_dam(*(object **)&local_198->au);
    iVar6 = object_weight_one((object *)obj_00);
    iVar10 = z_info->m_crit_chance_range;
    iVar17 = z_info->m_crit_chance_toh_skill_scl * state.skills[6] +
             (int)player->lev * z_info->m_crit_chance_level_scl +
             (wVar7 + state.to_h) * z_info->m_crit_chance_toh_scl +
             z_info->m_crit_chance_weight_scl * (int)iVar6 + z_info->m_crit_chance_offset;
    crit_round_add = L'\0';
    if (iVar17 < 1) {
      iVar17 = 0;
    }
    if (iVar10 < iVar17) {
      iVar17 = iVar10;
    }
    crit_div = L'd';
    if ((iVar17 < 1) || (z_info->m_crit_level_head == (critical_level *)0x0)) {
      crit_mult = L'd';
      crit_add = L'\0';
      crit_round_mult = L'\0';
      crit_scl_round = L'\x01';
    }
    else {
      iVar9 = z_info->m_crit_power_random;
      if (iVar9 < 1) {
        iVar19 = 0;
        iVar14 = 0;
      }
      else {
        iVar19 = (int)iVar6 * z_info->m_crit_power_weight_scl;
        wVar7 = iVar19 + iVar9;
        wVar20 = iVar19 + L'\x01';
        iVar14 = 0;
        iVar19 = 0;
        pcVar15 = z_info->m_crit_level_head;
        do {
          wVar1 = pcVar15->cutoff;
          wVar16 = wVar7 + L'\x01';
          if ((pcVar15->next == (critical_level *)0x0 || wVar7 < wVar1) ||
             (wVar16 = wVar1, wVar20 < wVar1)) {
            iVar19 = iVar19 + (pcVar15->mult + L'\xffffffff') * (wVar16 - wVar20);
            iVar14 = iVar14 + (wVar16 - wVar20) * pcVar15->add;
            wVar20 = wVar16;
          }
          pcVar15 = pcVar15->next;
        } while (wVar20 <= wVar7);
      }
      crit_scl_round = iVar9 * (iVar10 / 100);
      crit_round_mult = (iVar19 * iVar17) % crit_scl_round;
      crit_mult = (iVar19 * iVar17) / crit_scl_round + L'd';
      crit_add = (iVar14 * iVar17) / crit_scl_round;
      crit_round_add = (iVar14 * iVar17) % crit_scl_round;
    }
    local_1e8 = state.to_d * 10;
    iVar10 = wVar8 * 10;
    local_190 = 1;
    local_1e4 = state.num_blows;
    obj_00 = local_198;
    if (bVar24) {
LAB_001812f4:
      local_190 = (ulong)(uint)(player->state).ammo_mult;
    }
  }
  else {
    iVar6 = object_weight_one((object *)local_198);
    state_00 = (player_state *)(ulong)(uint)(ppVar3->state).to_h;
    if (bVar24) {
      calculate_missile_crits
                (state_00,(int)iVar6,wVar7,true,&crit_mult,&crit_add,&crit_div,&crit_round_mult,
                 &crit_round_add,&crit_scl_round);
      wVar7 = object_to_dam(*(object **)&obj_00->au);
      wVar8 = object_to_dam(poVar12->known);
      iVar11 = iVar11 + (wVar8 + wVar7) * 10;
      local_1e8 = 0;
      iVar10 = 0;
      local_1e4 = L'\0';
      goto LAB_001812f4;
    }
    local_1e8 = 0;
    calculate_missile_crits
              (state_00,(int)iVar6,wVar7,false,&crit_mult,&crit_add,&crit_div,&crit_round_mult,
               &crit_round_add,&crit_scl_round);
    wVar7 = object_to_dam(*(object **)&obj_00->au);
    iVar6 = object_weight_one((object *)obj_00);
    iVar11 = (int)(short)(iVar6 / 0xc + 2) * (iVar11 + wVar7 * 10);
    local_190 = 1;
    iVar10 = 0;
    local_1e4 = L'\0';
  }
  bVar21 = (bVar25 && bVar26) | (byte)local_1ac;
  total_brands = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  copy_brands(&total_brands,*(_Bool **)(*(long *)&obj_00->au + 0xd8));
  if (bVar23 && (bVar25 && bVar26)) {
    if (poVar12->known != (object *)0x0) {
      copy_brands(&total_brands,poVar12->known->brands);
    }
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    copy_slays(&total_slays,*(_Bool **)(*(long *)&obj_00->au + 0xe0));
    poVar12 = poVar12->known;
    if (poVar12 != (object *)0x0) goto LAB_00181395;
  }
  else {
    total_slays = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
    poVar12 = *(object **)&obj_00->au;
LAB_00181395:
    copy_slays(&total_slays,poVar12->slays);
  }
  *local_1b8 = false;
  if (_Var4 && bVar23) {
    if (2 < (player->body).count) {
      wVar7 = L'\x02';
      do {
        poVar12 = slot_object(player,wVar7);
        if (poVar12 != (object *)0x0) {
          source = poVar12->known->brands;
          if ((source != (_Bool *)0x0) || (poVar12->known->slays != (_Bool *)0x0)) {
            *local_1b8 = true;
            copy_brands(&total_brands,source);
            copy_slays(&total_slays,poVar12->known->slays);
          }
        }
        wVar7 = wVar7 + L'\x01';
      } while ((uint)wVar7 < (uint)(player->body).count);
    }
    if (1 < z_info->brand_max) {
      wVar7 = L'\x01';
      do {
        _Var5 = player_has_temporary_brand(player,wVar7);
        if ((_Var5) && (_Var5 = append_brand(&total_brands,wVar7), _Var5)) {
          *local_1b8 = true;
        }
        wVar7 = wVar7 + L'\x01';
      } while ((uint)wVar7 < (uint)z_info->brand_max);
    }
    if (1 < z_info->slay_max) {
      wVar7 = L'\x01';
      do {
        _Var5 = player_has_temporary_slay(player,wVar7);
        if ((_Var5) && (_Var5 = append_slay(&total_slays,wVar7), _Var5)) {
          *local_1b8 = true;
        }
        wVar7 = wVar7 + L'\x01';
      } while ((uint)wVar7 < (uint)z_info->slay_max);
    }
  }
  ppVar3 = player;
  paVar2 = z_info;
  iVar17 = bVar21 - 1;
  bVar21 = z_info->brand_max;
  local_178 = (ulong)(uint)crit_add;
  local_170 = (ulong)(uint)crit_round_add;
  local_1b8 = (_Bool *)CONCAT44(local_1b8._4_4_,crit_scl_round);
  if ((ulong)bVar21 < 2) {
    _Var5 = false;
  }
  else {
    local_1ac = (crit_div - (crit_div + L'\x01' >> 0x1f)) + 1 >> 1;
    local_198 = player;
    piVar22 = &brands[1].multiplier;
    uVar18 = 1;
    _Var5 = false;
    do {
      if (total_brands[uVar18] == true) {
        iVar9 = (*piVar22 + (int)local_190 + iVar17) * iVar11 + iVar10;
        iVar9 = (iVar9 * crit_round_mult + crit_round_add * 10) / crit_scl_round +
                iVar9 * crit_mult + crit_add * 10;
        iVar19 = iVar9 % crit_div;
        iVar9 = iVar9 / crit_div + local_1e8;
        if (_Var4 && bVar23) {
          iVar19 = (iVar19 * local_1e4) / crit_div + iVar9 * local_1e4;
          iVar9 = iVar19 / 100;
          iVar19 = iVar19 % 100;
          bVar27 = SBORROW4(iVar19,0x32);
          iVar19 = iVar19 + -0x32;
LAB_0018161b:
          bVar27 = bVar27 == iVar19 < 0;
        }
        else {
          if (bVar24) {
            wVar7 = (ppVar3->state).num_shots;
            iVar19 = (iVar19 * wVar7) / crit_div + iVar9 * wVar7;
            iVar9 = iVar19 / 10;
            iVar19 = iVar19 % 10;
            bVar27 = SBORROW4(iVar19,5);
            iVar19 = iVar19 + -5;
            goto LAB_0018161b;
          }
          bVar27 = local_1ac < iVar19;
        }
        local_160[uVar18] = (uint)bVar27 + iVar9;
        _Var5 = true;
      }
      uVar18 = uVar18 + 1;
      piVar22 = piVar22 + 0xe;
    } while (bVar21 != uVar18);
  }
  ppVar3 = player;
  bVar21 = paVar2->slay_max;
  if (1 < (ulong)bVar21) {
    iVar9 = (crit_div - (crit_div + L'\x01' >> 0x1f)) + 1 >> 1;
    piVar22 = &slays[1].multiplier;
    uVar18 = 1;
    do {
      if (total_slays[uVar18] == true) {
        iVar19 = (*piVar22 + iVar17 + (int)local_190) * iVar11 + iVar10;
        iVar19 = (iVar19 * crit_round_mult + crit_round_add * 10) / crit_scl_round +
                 iVar19 * crit_mult + crit_add * 10;
        iVar14 = iVar19 % crit_div;
        iVar19 = iVar19 / crit_div + local_1e8;
        if (_Var4 && bVar23) {
          iVar14 = (iVar14 * local_1e4) / crit_div + iVar19 * local_1e4;
          iVar19 = iVar14 / 100;
          iVar14 = iVar14 % 100;
          bVar27 = SBORROW4(iVar14,0x32);
          bVar24 = iVar14 + -0x32 < 0;
        }
        else if (bVar23 && (bVar25 && bVar26)) {
          wVar7 = (ppVar3->state).num_shots;
          iVar14 = (iVar14 * wVar7) / crit_div + iVar19 * wVar7;
          iVar19 = iVar14 / 10;
          iVar14 = iVar14 % 10;
          bVar27 = SBORROW4(iVar14,5);
          bVar24 = iVar14 + -5 < 0;
        }
        else {
          bVar27 = SBORROW4(iVar14,iVar9);
          bVar24 = iVar14 - iVar9 < 0;
        }
        local_158[uVar18] = (uint)(bVar27 == bVar24) + iVar19;
        _Var5 = true;
      }
      uVar18 = uVar18 + 1;
      piVar22 = piVar22 + 0x10;
    } while (bVar21 != uVar18);
  }
  iVar10 = (int)local_190 * iVar11 + iVar10;
  iVar11 = (crit_round_mult * iVar10 + crit_round_add * 10) / crit_scl_round +
           crit_mult * iVar10 + crit_add * 10;
  iVar10 = iVar11 % crit_div;
  local_1e8 = iVar11 / crit_div + local_1e8;
  if (_Var4 && bVar23) {
    iVar11 = (iVar10 * local_1e4) / crit_div + local_1e8 * local_1e4;
    local_1e8 = iVar11 / 100;
    iVar11 = iVar11 % 100;
    bVar23 = SBORROW4(iVar11,0x32);
    iVar11 = iVar11 + -0x32;
  }
  else {
    if (!bVar23 || (!bVar25 || !bVar26)) {
      bVar23 = (crit_div - (crit_div + L'\x01' >> 0x1f)) + 1 >> 1 < iVar10;
      goto LAB_00181873;
    }
    wVar7 = (player->state).num_shots;
    iVar11 = (iVar10 * wVar7) / crit_div + local_1e8 * wVar7;
    local_1e8 = iVar11 / 10;
    iVar11 = iVar11 % 10;
    bVar23 = SBORROW4(iVar11,5);
    iVar11 = iVar11 + -5;
  }
  bVar23 = bVar23 == iVar11 < 0;
LAB_00181873:
  *local_168 = (uint)bVar23 + local_1e8;
  mem_free(total_brands);
  mem_free(total_slays);
  return _Var5;
}

Assistant:

bool obj_known_damage(const struct object *obj, int *normal_damage,
							 int *brand_damage, int *slay_damage,
							 bool *nonweap_slay, bool throw)
{
	int i;
	int dice, sides, dam, total_dam, plus = 0;
	int xtra_postcrit = 0, xtra_precrit = 0;
	int crit_mult, crit_div, crit_add;
	int crit_round_mult, crit_round_add, crit_scl_round;
	int temp0, temp1, round;
	int old_blows = 0;
	bool *total_brands;
	bool *total_slays;
	bool has_brands_or_slays = false;

	struct object *bow = equipped_item_by_slot_name(player, "shooting");
	bool weapon = tval_is_melee_weapon(obj) && !throw;
	bool ammo   = (player->state.ammo_tval == obj->tval) && (bow) && !throw;
	int melee_adj_mult = (ammo || throw) ? 0 : 1;
	int multiplier = 1;

	struct player_state state;
	int weapon_slot = slot_by_name(player, "weapon");
	struct object *current_weapon = slot_object(player, weapon_slot);

	/* Pretend we're wielding the object if it's a weapon */
	if (weapon)
		player->body.slots[weapon_slot].obj = (struct object *) obj;

	/* Calculate the player's hypothetical state */
	memcpy(&state, &player->state, sizeof(state));
	state.stat_ind[STAT_STR] = 0; //Hack - NRM
	state.stat_ind[STAT_DEX] = 0; //Hack - NRM
	calc_bonuses(player, &state, true, false);

	/* Stop pretending */
	player->body.slots[weapon_slot].obj = current_weapon;

	/* Finish if dice not known */
	dice = obj->known->dd;
	sides = obj->known->ds;
	if (!dice || !sides) return false;

	/* Calculate damage */
	dam = ((sides + 1) * dice * 5);

	plus += object_to_hit(obj->known);
	if (weapon)	{
		xtra_postcrit = state.to_d * 10;
		xtra_precrit += object_to_dam(obj->known) * 10;

		calculate_melee_crits(&state, object_weight_one(obj), plus,
			&crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		old_blows = state.num_blows;
	} else if (ammo) {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, true, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam += (object_to_dam(bow->known) * 10);
	} else {
		calculate_missile_crits(&player->state, object_weight_one(obj),
			plus, false, &crit_mult, &crit_add, &crit_div,
			&crit_round_mult, &crit_round_add, &crit_scl_round);

		dam += (object_to_dam(obj->known) * 10);
		dam *= 2 + object_weight_one(obj) / 12;
	}

	if (ammo) multiplier = player->state.ammo_mult;

	/* Get the brands */
	total_brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	copy_brands(&total_brands, obj->known->brands);
	if (ammo && bow->known)
		copy_brands(&total_brands, bow->known->brands);

	/* Get the slays */
	total_slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	copy_slays(&total_slays, obj->known->slays);
	if (ammo && bow->known)
		copy_slays(&total_slays, bow->known->slays);

	/*
	 * Melee weapons may get slays and brands from other items or from
	 * temporary effects.
	 */
	*nonweap_slay = false;
	if (weapon)	{
		for (i = 2; i < player->body.count; i++) {
			struct object *slot_obj = slot_object(player, i);
			if (!slot_obj)
				continue;

			if (slot_obj->known->brands || slot_obj->known->slays)
				*nonweap_slay = true;
			else
				continue;

			/* Replace the old lists with new ones */
			copy_brands(&total_brands, slot_obj->known->brands);
			copy_slays(&total_slays, slot_obj->known->slays);
		}

		for (i = 1; i < z_info->brand_max; i++) {
			if (player_has_temporary_brand(player, i)
					&& append_brand(&total_brands, i)) {
				*nonweap_slay = true;
			}
		}

		for (i = 1; i < z_info->slay_max; i++) {
			if (player_has_temporary_slay(player, i)
					&& append_slay(&total_slays, i)) {
				*nonweap_slay = true;
			}
		}
	}

	/* Get damage for each brand that is active */
	for (i = 1; i < z_info->brand_max; i++) {
		if (!total_brands[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and brand in stated average */
		temp0 = dam * (multiplier + brands[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
		}

		brand_damage[i] = total_dam;
	}

	/* Get damage for each slay that is active */
	for (i = 1; i < z_info->slay_max; i++) {
		if (!total_slays[i]) {
			continue;
		}
		has_brands_or_slays = true;

		/* Include bonus damage and slay in stated average */
		temp0 = dam * (multiplier + slays[i].multiplier
			- melee_adj_mult) + xtra_precrit;
		temp1 = temp0 * crit_mult + 10 * crit_add
			+ (temp0 * crit_round_mult + 10 * crit_round_add)
			/ crit_scl_round;
		total_dam = temp1 / crit_div + xtra_postcrit;
		round = temp1 % crit_div;

		if (weapon) {
			temp0 = total_dam * old_blows
				+ (round * old_blows) / crit_div;
			total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
		} else if (ammo) {
			temp0 = total_dam * player->state.num_shots
				+ (round * player->state.num_shots) / crit_div;
			total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
		} else {
			total_dam += (round >= (crit_div + 1) / 2) ? 1 : 0;
		}

		slay_damage[i] = total_dam;
	}

	/* Include bonus damage in stated average */
	temp0 = dam * multiplier + xtra_precrit;
	temp1 = temp0 * crit_mult + 10 * crit_add
		+ (temp0 * crit_round_mult + 10 * crit_round_add)
		/ crit_scl_round;
	total_dam = temp1 / crit_div + xtra_postcrit;
	round = temp1 % crit_div;

	/* Normal damage, not considering brands or slays */
	if (weapon) {
		temp0 = total_dam * old_blows
			+ (round * old_blows) / crit_div;
		total_dam = temp0 / 100 + ((temp0 % 100 >= 50) ? 1 : 0);
	} else if (ammo) {
		temp0 = total_dam * player->state.num_shots
			+ (round * player->state.num_shots) / crit_div;
		total_dam = temp0 / 10 + ((temp0 % 10 >= 5) ? 1 : 0);
	} else {
		total_dam += (round > (crit_div + 1) / 2) ? 1 : 0;
	}

	*normal_damage = total_dam;

	mem_free(total_brands);
	mem_free(total_slays);
	return has_brands_or_slays;
}